

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O3

void gen_xsxsigqp(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGTemp *a1;
  TCGTemp *ts;
  TCGTemp *pTVar1;
  TCGv_i64 arg;
  TCGTemp *ts_00;
  TCGv_i64 c2;
  TCGv_i64 c2_00;
  uintptr_t o;
  TCGv_i64 ret;
  uintptr_t o_3;
  uintptr_t o_4;
  uintptr_t o_2;
  uintptr_t o_1;
  TCGv_i64 ret_00;
  
  if (ctx->vsx_enabled != false) {
    s = ctx->uc->tcg_ctx;
    a1 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    ts = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    pTVar1 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    arg = (TCGv_i64)((long)pTVar1 - (long)s);
    ts_00 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)pTVar1,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)(ctx->opcode >> 7 & 0x1f0) + 0x12d28);
    tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)ts_00,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)(ctx->opcode >> 7 & 0x1f0) + 0x12d20);
    pTVar1 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    ret_00 = (TCGv_i64)((long)pTVar1 - (long)s);
    pTVar1 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    ret = (TCGv_i64)((long)pTVar1 - (long)s);
    c2 = tcg_const_i64_ppc64(s,0);
    c2_00 = tcg_const_i64_ppc64(s,0x7fff);
    tcg_gen_extract_i64_ppc64(s,ret_00,arg,0x30,0xf);
    tcg_gen_op2_ppc64(s,INDEX_op_movi_i64,(TCGArg)pTVar1,0x1000000000000);
    tcg_gen_movcond_i64_ppc64(s,TCG_COND_EQ,ret,ret_00,c2,c2,ret);
    tcg_gen_movcond_i64_ppc64(s,TCG_COND_EQ,ret,ret_00,c2_00,c2,ret);
    tcg_gen_deposit_i64_ppc64(s,(TCGv_i64)((long)a1 - (long)s),ret,arg,0,0x30);
    tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)a1,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)(ctx->opcode >> 0x11 & 0x1f0) + 0x12d28);
    if (ts != ts_00) {
      tcg_gen_op2_ppc64(s,INDEX_op_mov_i64,(TCGArg)ts,(TCGArg)ts_00);
    }
    tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)ts,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)(ctx->opcode >> 0x11 & 0x1f0) + 0x12d20);
    tcg_temp_free_internal_ppc64(s,(TCGTemp *)(ret + (long)s));
    tcg_temp_free_internal_ppc64(s,(TCGTemp *)(ret_00 + (long)s));
    tcg_temp_free_internal_ppc64(s,(TCGTemp *)(c2 + (long)s));
    tcg_temp_free_internal_ppc64(s,(TCGTemp *)(c2_00 + (long)s));
    tcg_temp_free_internal_ppc64(s,(TCGTemp *)((TCGv_i64)((long)a1 - (long)s) + (long)s));
    tcg_temp_free_internal_ppc64(s,ts);
    tcg_temp_free_internal_ppc64(s,(TCGTemp *)(arg + (long)s));
    tcg_temp_free_internal_ppc64(s,ts_00);
    return;
  }
  gen_exception(ctx,0x5e);
  return;
}

Assistant:

static void gen_xsxsigqp(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 t0, zr, nan, exp;
    TCGv_i64 xth;
    TCGv_i64 xtl;
    TCGv_i64 xbh;
    TCGv_i64 xbl;

    if (unlikely(!ctx->vsx_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VSXU);
        return;
    }
    xth = tcg_temp_new_i64(tcg_ctx);
    xtl = tcg_temp_new_i64(tcg_ctx);
    xbh = tcg_temp_new_i64(tcg_ctx);
    xbl = tcg_temp_new_i64(tcg_ctx);
    get_cpu_vsrh(tcg_ctx, xbh, rB(ctx->opcode) + 32);
    get_cpu_vsrl(tcg_ctx, xbl, rB(ctx->opcode) + 32);
    exp = tcg_temp_new_i64(tcg_ctx);
    t0 = tcg_temp_new_i64(tcg_ctx);
    zr = tcg_const_i64(tcg_ctx, 0);
    nan = tcg_const_i64(tcg_ctx, 32767);

    tcg_gen_extract_i64(tcg_ctx, exp, xbh, 48, 15);
    tcg_gen_movi_i64(tcg_ctx, t0, 0x0001000000000000);
    tcg_gen_movcond_i64(tcg_ctx, TCG_COND_EQ, t0, exp, zr, zr, t0);
    tcg_gen_movcond_i64(tcg_ctx, TCG_COND_EQ, t0, exp, nan, zr, t0);
    tcg_gen_deposit_i64(tcg_ctx, xth, t0, xbh, 0, 48);
    set_cpu_vsrh(tcg_ctx, rD(ctx->opcode) + 32, xth);
    tcg_gen_mov_i64(tcg_ctx, xtl, xbl);
    set_cpu_vsrl(tcg_ctx, rD(ctx->opcode) + 32, xtl);

    tcg_temp_free_i64(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, exp);
    tcg_temp_free_i64(tcg_ctx, zr);
    tcg_temp_free_i64(tcg_ctx, nan);
    tcg_temp_free_i64(tcg_ctx, xth);
    tcg_temp_free_i64(tcg_ctx, xtl);
    tcg_temp_free_i64(tcg_ctx, xbh);
    tcg_temp_free_i64(tcg_ctx, xbl);
}